

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 (*pauVar38) [16];
  int iVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  ulong uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar57 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar91;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  float fVar99;
  undefined1 auVar100 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  float fVar111;
  float fVar114;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  undefined4 uVar119;
  float fVar121;
  undefined1 auVar120 [32];
  float fVar122;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar123 [32];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [32];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [32];
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [16];
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar50 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1450._4_4_ = uVar119;
  local_1450._0_4_ = uVar119;
  local_1450._8_4_ = uVar119;
  local_1450._12_4_ = uVar119;
  auVar98 = ZEXT1664(local_1450);
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = uVar119;
  local_1460._0_4_ = uVar119;
  local_1460._8_4_ = uVar119;
  local_1460._12_4_ = uVar119;
  auVar101 = ZEXT1664(local_1460);
  uVar119 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1470._4_4_ = uVar119;
  local_1470._0_4_ = uVar119;
  local_1470._8_4_ = uVar119;
  local_1470._12_4_ = uVar119;
  auVar110 = ZEXT1664(local_1470);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar127 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar111 = fVar122 * 0.99999964;
  fVar115 = fVar127 * 0.99999964;
  fVar118 = fVar132 * 0.99999964;
  fVar122 = fVar122 * 1.0000004;
  fVar127 = fVar127 * 1.0000004;
  fVar132 = fVar132 * 1.0000004;
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar39 = (tray->tnear).field_0.i[k];
  local_1510._4_4_ = iVar39;
  local_1510._0_4_ = iVar39;
  local_1510._8_4_ = iVar39;
  local_1510._12_4_ = iVar39;
  auVar97 = ZEXT1664(local_1510);
  iVar39 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT1664(CONCAT412(iVar39,CONCAT48(iVar39,CONCAT44(iVar39,iVar39))));
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  iVar39 = 1 << ((uint)k & 0x1f);
  auVar58._4_4_ = iVar39;
  auVar58._0_4_ = iVar39;
  auVar58._8_4_ = iVar39;
  auVar58._12_4_ = iVar39;
  auVar58._16_4_ = iVar39;
  auVar58._20_4_ = iVar39;
  auVar58._24_4_ = iVar39;
  auVar58._28_4_ = iVar39;
  auVar59 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar58 = vpand_avx2(auVar58,auVar59);
  local_1260 = vpcmpeqd_avx2(auVar58,auVar59);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar64._16_4_ = 0x3f800000;
  auVar64._20_4_ = 0x3f800000;
  auVar64._24_4_ = 0x3f800000;
  auVar64._28_4_ = 0x3f800000;
  auVar59._8_4_ = 0xbf800000;
  auVar59._0_8_ = 0xbf800000bf800000;
  auVar59._12_4_ = 0xbf800000;
  auVar59._16_4_ = 0xbf800000;
  auVar59._20_4_ = 0xbf800000;
  auVar59._24_4_ = 0xbf800000;
  auVar59._28_4_ = 0xbf800000;
  _local_1240 = vblendvps_avx(auVar64,auVar59,local_1220);
  fVar114 = fVar111;
  fVar86 = fVar111;
  fVar99 = fVar111;
  fVar91 = fVar115;
  fVar92 = fVar115;
  fVar93 = fVar115;
  fVar94 = fVar118;
  fVar95 = fVar118;
  fVar121 = fVar118;
  fVar124 = fVar122;
  fVar125 = fVar122;
  fVar126 = fVar122;
  fVar129 = fVar127;
  fVar130 = fVar127;
  fVar131 = fVar127;
  fVar134 = fVar132;
  fVar135 = fVar132;
  fVar136 = fVar132;
  local_14d0 = fVar132;
  fStack_14cc = fVar132;
  fStack_14c8 = fVar132;
  fStack_14c4 = fVar132;
  local_14c0 = fVar127;
  fStack_14bc = fVar127;
  fStack_14b8 = fVar127;
  fStack_14b4 = fVar127;
  local_14b0 = fVar122;
  fStack_14ac = fVar122;
  fStack_14a8 = fVar122;
  fStack_14a4 = fVar122;
  local_14a0 = fVar118;
  fStack_149c = fVar118;
  fStack_1498 = fVar118;
  fStack_1494 = fVar118;
  local_1490 = fVar115;
  fStack_148c = fVar115;
  fStack_1488 = fVar115;
  fStack_1484 = fVar115;
  local_1480 = fVar111;
  fStack_147c = fVar111;
  fStack_1478 = fVar111;
  fStack_1474 = fVar111;
LAB_01608612:
  do {
    do {
      if (pauVar50 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar38 = pauVar50 + -1;
      pauVar50 = pauVar50 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar38 + 8));
    uVar42 = *(ulong *)*pauVar50;
    while ((uVar42 & 8) == 0) {
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar49),auVar98._0_16_);
      auVar56._0_4_ = fVar111 * auVar57._0_4_;
      auVar56._4_4_ = fVar114 * auVar57._4_4_;
      auVar56._8_4_ = fVar86 * auVar57._8_4_;
      auVar56._12_4_ = fVar99 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar48),auVar101._0_16_);
      auVar67._0_4_ = fVar115 * auVar57._0_4_;
      auVar67._4_4_ = fVar91 * auVar57._4_4_;
      auVar67._8_4_ = fVar92 * auVar57._8_4_;
      auVar67._12_4_ = fVar93 * auVar57._12_4_;
      auVar57 = vmaxps_avx(auVar56,auVar67);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + uVar47),auVar110._0_16_);
      auVar68._0_4_ = fVar118 * auVar56._0_4_;
      auVar68._4_4_ = fVar94 * auVar56._4_4_;
      auVar68._8_4_ = fVar95 * auVar56._8_4_;
      auVar68._12_4_ = fVar121 * auVar56._12_4_;
      auVar56 = vmaxps_avx(auVar68,auVar97._0_16_);
      local_1420 = vmaxps_avx(auVar57,auVar56);
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar49 ^ 0x10)),auVar98._0_16_);
      auVar69._0_4_ = fVar122 * auVar57._0_4_;
      auVar69._4_4_ = fVar124 * auVar57._4_4_;
      auVar69._8_4_ = fVar125 * auVar57._8_4_;
      auVar69._12_4_ = fVar126 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar48 ^ 0x10)),auVar101._0_16_);
      auVar74._0_4_ = fVar127 * auVar57._0_4_;
      auVar74._4_4_ = fVar129 * auVar57._4_4_;
      auVar74._8_4_ = fVar130 * auVar57._8_4_;
      auVar74._12_4_ = fVar131 * auVar57._12_4_;
      auVar57 = vminps_avx(auVar69,auVar74);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar42 + 0x20 + (uVar47 ^ 0x10)),auVar110._0_16_);
      auVar75._0_4_ = fVar132 * auVar56._0_4_;
      auVar75._4_4_ = fVar134 * auVar56._4_4_;
      auVar75._8_4_ = fVar135 * auVar56._8_4_;
      auVar75._12_4_ = fVar136 * auVar56._12_4_;
      auVar56 = vminps_avx(auVar75,auVar55._0_16_);
      auVar57 = vminps_avx(auVar57,auVar56);
      auVar57 = vcmpps_avx(local_1420,auVar57,2);
      uVar40 = vmovmskps_avx(auVar57);
      if (uVar40 == 0) goto LAB_01608612;
      uVar40 = uVar40 & 0xff;
      uVar51 = uVar42 & 0xfffffffffffffff0;
      lVar44 = 0;
      for (uVar42 = (ulong)uVar40; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
        lVar44 = lVar44 + 1;
      }
      uVar42 = *(ulong *)(uVar51 + lVar44 * 8);
      uVar40 = uVar40 - 1 & uVar40;
      uVar45 = (ulong)uVar40;
      if (uVar40 != 0) {
        uVar41 = *(uint *)(local_1420 + lVar44 * 4);
        lVar44 = 0;
        for (; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
          lVar44 = lVar44 + 1;
        }
        uVar40 = uVar40 - 1 & uVar40;
        uVar46 = (ulong)uVar40;
        uVar45 = *(ulong *)(uVar51 + lVar44 * 8);
        uVar3 = *(uint *)(local_1420 + lVar44 * 4);
        if (uVar40 == 0) {
          if (uVar41 < uVar3) {
            *(ulong *)*pauVar50 = uVar45;
            *(uint *)(*pauVar50 + 8) = uVar3;
            pauVar50 = pauVar50 + 1;
          }
          else {
            *(ulong *)*pauVar50 = uVar42;
            *(uint *)(*pauVar50 + 8) = uVar41;
            pauVar50 = pauVar50 + 1;
            uVar42 = uVar45;
          }
        }
        else {
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar42;
          auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar41));
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar45;
          auVar56 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar3));
          lVar44 = 0;
          for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar44 = lVar44 + 1;
          }
          uVar40 = uVar40 - 1 & uVar40;
          uVar42 = (ulong)uVar40;
          auVar76._8_8_ = 0;
          auVar76._0_8_ = *(ulong *)(uVar51 + lVar44 * 8);
          auVar68 = vpunpcklqdq_avx(auVar76,ZEXT416(*(uint *)(local_1420 + lVar44 * 4)));
          auVar67 = vpcmpgtd_avx(auVar56,auVar57);
          if (uVar40 == 0) {
            auVar69 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar56,auVar57,auVar69);
            auVar57 = vblendvps_avx(auVar57,auVar56,auVar69);
            auVar56 = vpcmpgtd_avx(auVar68,auVar67);
            auVar69 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar68,auVar67,auVar69);
            auVar67 = vblendvps_avx(auVar67,auVar68,auVar69);
            auVar68 = vpcmpgtd_avx(auVar67,auVar57);
            auVar69 = vpshufd_avx(auVar68,0xaa);
            auVar68 = vblendvps_avx(auVar67,auVar57,auVar69);
            auVar57 = vblendvps_avx(auVar57,auVar67,auVar69);
            *pauVar50 = auVar57;
            pauVar50[1] = auVar68;
            uVar42 = auVar56._0_8_;
            pauVar50 = pauVar50 + 2;
          }
          else {
            lVar44 = 0;
            for (; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
              lVar44 = lVar44 + 1;
            }
            auVar87._8_8_ = 0;
            auVar87._0_8_ = *(ulong *)(uVar51 + lVar44 * 8);
            auVar74 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_1420 + lVar44 * 4)));
            auVar69 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar56,auVar57,auVar69);
            auVar57 = vblendvps_avx(auVar57,auVar56,auVar69);
            auVar56 = vpcmpgtd_avx(auVar74,auVar68);
            auVar69 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar74,auVar68,auVar69);
            auVar68 = vblendvps_avx(auVar68,auVar74,auVar69);
            auVar69 = vpcmpgtd_avx(auVar68,auVar57);
            auVar74 = vpshufd_avx(auVar69,0xaa);
            auVar69 = vblendvps_avx(auVar68,auVar57,auVar74);
            auVar57 = vblendvps_avx(auVar57,auVar68,auVar74);
            auVar68 = vpcmpgtd_avx(auVar56,auVar67);
            auVar74 = vpshufd_avx(auVar68,0xaa);
            auVar68 = vblendvps_avx(auVar56,auVar67,auVar74);
            auVar56 = vblendvps_avx(auVar67,auVar56,auVar74);
            auVar67 = vpcmpgtd_avx(auVar69,auVar56);
            auVar74 = vpshufd_avx(auVar67,0xaa);
            auVar67 = vblendvps_avx(auVar69,auVar56,auVar74);
            auVar56 = vblendvps_avx(auVar56,auVar69,auVar74);
            *pauVar50 = auVar57;
            pauVar50[1] = auVar56;
            pauVar50[2] = auVar67;
            auVar97 = ZEXT1664(local_1510);
            uVar42 = auVar68._0_8_;
            pauVar50 = pauVar50 + 3;
          }
        }
      }
    }
    uVar51 = uVar42 & 0xfffffffffffffff0;
    for (lVar44 = 0; lVar44 != (ulong)((uint)uVar42 & 0xf) - 8; lVar44 = lVar44 + 1) {
      lVar43 = lVar44 * 0x60;
      pSVar4 = context->scene;
      ppfVar5 = (pSVar4->vertices).items;
      pfVar6 = ppfVar5[*(uint *)(uVar51 + 0x40 + lVar43)];
      auVar71._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + 0x20 + lVar43));
      auVar71._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + lVar43));
      pfVar7 = ppfVar5[*(uint *)(uVar51 + 0x48 + lVar43)];
      auVar77._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x28 + lVar43));
      auVar77._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 8 + lVar43));
      pfVar8 = ppfVar5[*(uint *)(uVar51 + 0x44 + lVar43)];
      auVar88._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x24 + lVar43));
      auVar88._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 4 + lVar43));
      pfVar9 = ppfVar5[*(uint *)(uVar51 + 0x4c + lVar43)];
      auVar108._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x2c + lVar43));
      auVar108._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0xc + lVar43));
      lVar1 = uVar51 + 0x40 + lVar43;
      local_10e0 = *(undefined8 *)(lVar1 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      lVar1 = uVar51 + 0x50 + lVar43;
      local_1440 = *(undefined8 *)(lVar1 + 0x10);
      uStack_1438 = *(undefined8 *)(lVar1 + 0x18);
      auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + 0x10 + lVar43)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x18 + lVar43)));
      auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + 0x10 + lVar43)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x18 + lVar43)));
      auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x14 + lVar43)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x1c + lVar43)));
      auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x14 + lVar43)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x1c + lVar43)));
      auVar69 = vunpcklps_avx(auVar57,auVar56);
      auVar74 = vunpcklps_avx(auVar67,auVar68);
      auVar57 = vunpckhps_avx(auVar67,auVar68);
      auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + 0x30 + lVar43)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x38 + lVar43)));
      auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar51 + 0x30 + lVar43)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar51 + 0x38 + lVar43)));
      auVar75 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x34 + lVar43)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x3c + lVar43)));
      auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar51 + 0x34 + lVar43)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar51 + 0x3c + lVar43)));
      auVar67 = vunpcklps_avx(auVar56,auVar67);
      auVar70 = vunpcklps_avx(auVar68,auVar75);
      auVar56 = vunpckhps_avx(auVar68,auVar75);
      uStack_1430 = local_1440;
      uStack_1428 = uStack_1438;
      auVar58 = vunpcklps_avx(auVar88,auVar108);
      auVar59 = vunpcklps_avx(auVar71,auVar77);
      auVar84 = vunpcklps_avx(auVar59,auVar58);
      auVar58 = vunpckhps_avx(auVar59,auVar58);
      auVar59 = vunpckhps_avx(auVar88,auVar108);
      auVar64 = vunpckhps_avx(auVar71,auVar77);
      auVar59 = vunpcklps_avx(auVar64,auVar59);
      auVar78._16_16_ = auVar74;
      auVar78._0_16_ = auVar74;
      auVar89._16_16_ = auVar57;
      auVar89._0_16_ = auVar57;
      auVar60._16_16_ = auVar69;
      auVar60._0_16_ = auVar69;
      auVar133._16_16_ = auVar70;
      auVar133._0_16_ = auVar70;
      auVar81._16_16_ = auVar56;
      auVar81._0_16_ = auVar56;
      uVar119 = *(undefined4 *)(ray + k * 4);
      auVar100._4_4_ = uVar119;
      auVar100._0_4_ = uVar119;
      auVar100._8_4_ = uVar119;
      auVar100._12_4_ = uVar119;
      auVar100._16_4_ = uVar119;
      auVar100._20_4_ = uVar119;
      auVar100._24_4_ = uVar119;
      auVar100._28_4_ = uVar119;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar116._4_4_ = uVar119;
      auVar116._0_4_ = uVar119;
      auVar116._8_4_ = uVar119;
      auVar116._12_4_ = uVar119;
      auVar116._16_4_ = uVar119;
      auVar116._20_4_ = uVar119;
      auVar116._24_4_ = uVar119;
      auVar116._28_4_ = uVar119;
      auVar52._16_16_ = auVar67;
      auVar52._0_16_ = auVar67;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar123._4_4_ = uVar119;
      auVar123._0_4_ = uVar119;
      auVar123._8_4_ = uVar119;
      auVar123._12_4_ = uVar119;
      auVar123._16_4_ = uVar119;
      auVar123._20_4_ = uVar119;
      auVar123._24_4_ = uVar119;
      auVar123._28_4_ = uVar119;
      auVar84 = vsubps_avx(auVar84,auVar100);
      auVar71 = vsubps_avx(auVar58,auVar116);
      local_15a0 = vsubps_avx(auVar59,auVar123);
      auVar58 = vsubps_avx(auVar78,auVar100);
      auVar59 = vsubps_avx(auVar89,auVar116);
      auVar64 = vsubps_avx(auVar60,auVar123);
      auVar60 = vsubps_avx(auVar133,auVar100);
      auVar77 = vsubps_avx(auVar81,auVar116);
      auVar17 = vsubps_avx(auVar52,auVar123);
      local_1100 = vsubps_avx(auVar60,auVar84);
      local_1140 = vsubps_avx(auVar77,auVar71);
      local_1120 = vsubps_avx(auVar17,local_15a0);
      auVar53._0_4_ = auVar84._0_4_ + auVar60._0_4_;
      auVar53._4_4_ = auVar84._4_4_ + auVar60._4_4_;
      auVar53._8_4_ = auVar84._8_4_ + auVar60._8_4_;
      auVar53._12_4_ = auVar84._12_4_ + auVar60._12_4_;
      auVar53._16_4_ = auVar84._16_4_ + auVar60._16_4_;
      auVar53._20_4_ = auVar84._20_4_ + auVar60._20_4_;
      auVar53._24_4_ = auVar84._24_4_ + auVar60._24_4_;
      auVar53._28_4_ = auVar84._28_4_ + auVar60._28_4_;
      auVar72._0_4_ = auVar71._0_4_ + auVar77._0_4_;
      auVar72._4_4_ = auVar71._4_4_ + auVar77._4_4_;
      auVar72._8_4_ = auVar71._8_4_ + auVar77._8_4_;
      auVar72._12_4_ = auVar71._12_4_ + auVar77._12_4_;
      auVar72._16_4_ = auVar71._16_4_ + auVar77._16_4_;
      auVar72._20_4_ = auVar71._20_4_ + auVar77._20_4_;
      auVar72._24_4_ = auVar71._24_4_ + auVar77._24_4_;
      auVar72._28_4_ = auVar71._28_4_ + auVar77._28_4_;
      fVar122 = local_15a0._0_4_;
      auVar82._0_4_ = auVar17._0_4_ + fVar122;
      fVar127 = local_15a0._4_4_;
      auVar82._4_4_ = auVar17._4_4_ + fVar127;
      fVar132 = local_15a0._8_4_;
      auVar82._8_4_ = auVar17._8_4_ + fVar132;
      fVar111 = local_15a0._12_4_;
      auVar82._12_4_ = auVar17._12_4_ + fVar111;
      fVar115 = local_15a0._16_4_;
      auVar82._16_4_ = auVar17._16_4_ + fVar115;
      fVar118 = local_15a0._20_4_;
      auVar82._20_4_ = auVar17._20_4_ + fVar118;
      fVar114 = local_15a0._24_4_;
      auVar82._24_4_ = auVar17._24_4_ + fVar114;
      fVar86 = local_15a0._28_4_;
      auVar82._28_4_ = auVar17._28_4_ + fVar86;
      auVar18._4_4_ = local_1120._4_4_ * auVar72._4_4_;
      auVar18._0_4_ = local_1120._0_4_ * auVar72._0_4_;
      auVar18._8_4_ = local_1120._8_4_ * auVar72._8_4_;
      auVar18._12_4_ = local_1120._12_4_ * auVar72._12_4_;
      auVar18._16_4_ = local_1120._16_4_ * auVar72._16_4_;
      auVar18._20_4_ = local_1120._20_4_ * auVar72._20_4_;
      auVar18._24_4_ = local_1120._24_4_ * auVar72._24_4_;
      auVar18._28_4_ = uVar119;
      auVar56 = vfmsub231ps_fma(auVar18,local_1140,auVar82);
      auVar19._4_4_ = local_1100._4_4_ * auVar82._4_4_;
      auVar19._0_4_ = local_1100._0_4_ * auVar82._0_4_;
      auVar19._8_4_ = local_1100._8_4_ * auVar82._8_4_;
      auVar19._12_4_ = local_1100._12_4_ * auVar82._12_4_;
      auVar19._16_4_ = local_1100._16_4_ * auVar82._16_4_;
      auVar19._20_4_ = local_1100._20_4_ * auVar82._20_4_;
      auVar19._24_4_ = local_1100._24_4_ * auVar82._24_4_;
      auVar19._28_4_ = auVar82._28_4_;
      auVar57 = vfmsub231ps_fma(auVar19,local_1120,auVar53);
      auVar20._4_4_ = local_1140._4_4_ * auVar53._4_4_;
      auVar20._0_4_ = local_1140._0_4_ * auVar53._0_4_;
      auVar20._8_4_ = local_1140._8_4_ * auVar53._8_4_;
      auVar20._12_4_ = local_1140._12_4_ * auVar53._12_4_;
      auVar20._16_4_ = local_1140._16_4_ * auVar53._16_4_;
      auVar20._20_4_ = local_1140._20_4_ * auVar53._20_4_;
      auVar20._24_4_ = local_1140._24_4_ * auVar53._24_4_;
      auVar20._28_4_ = auVar53._28_4_;
      auVar67 = vfmsub231ps_fma(auVar20,local_1100,auVar72);
      uVar119 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar117._4_4_ = uVar119;
      auVar117._0_4_ = uVar119;
      auVar117._8_4_ = uVar119;
      auVar117._12_4_ = uVar119;
      auVar117._16_4_ = uVar119;
      auVar117._20_4_ = uVar119;
      auVar117._24_4_ = uVar119;
      auVar117._28_4_ = uVar119;
      local_1180 = *(float *)(ray + k * 4 + 0xc0);
      auVar21._4_4_ = local_1180 * auVar67._4_4_;
      auVar21._0_4_ = local_1180 * auVar67._0_4_;
      auVar21._8_4_ = local_1180 * auVar67._8_4_;
      auVar21._12_4_ = local_1180 * auVar67._12_4_;
      auVar21._16_4_ = local_1180 * 0.0;
      auVar21._20_4_ = local_1180 * 0.0;
      auVar21._24_4_ = local_1180 * 0.0;
      auVar21._28_4_ = auVar72._28_4_;
      auVar57 = vfmadd231ps_fma(auVar21,auVar117,ZEXT1632(auVar57));
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_1160._4_4_ = uVar119;
      local_1160._0_4_ = uVar119;
      local_1160._8_4_ = uVar119;
      local_1160._12_4_ = uVar119;
      local_1160._16_4_ = uVar119;
      local_1160._20_4_ = uVar119;
      local_1160._24_4_ = uVar119;
      local_1160._28_4_ = uVar119;
      local_1420 = vfmadd231ps_fma(ZEXT1632(auVar57),local_1160,ZEXT1632(auVar56));
      local_11a0 = vsubps_avx(auVar71,auVar59);
      local_11c0 = vsubps_avx(local_15a0,auVar64);
      auVar128._0_4_ = auVar71._0_4_ + auVar59._0_4_;
      auVar128._4_4_ = auVar71._4_4_ + auVar59._4_4_;
      auVar128._8_4_ = auVar71._8_4_ + auVar59._8_4_;
      auVar128._12_4_ = auVar71._12_4_ + auVar59._12_4_;
      auVar128._16_4_ = auVar71._16_4_ + auVar59._16_4_;
      auVar128._20_4_ = auVar71._20_4_ + auVar59._20_4_;
      auVar128._24_4_ = auVar71._24_4_ + auVar59._24_4_;
      auVar128._28_4_ = auVar71._28_4_ + auVar59._28_4_;
      auVar83._0_4_ = fVar122 + auVar64._0_4_;
      auVar83._4_4_ = fVar127 + auVar64._4_4_;
      auVar83._8_4_ = fVar132 + auVar64._8_4_;
      auVar83._12_4_ = fVar111 + auVar64._12_4_;
      auVar83._16_4_ = fVar115 + auVar64._16_4_;
      auVar83._20_4_ = fVar118 + auVar64._20_4_;
      auVar83._24_4_ = fVar114 + auVar64._24_4_;
      fVar99 = auVar64._28_4_;
      auVar83._28_4_ = fVar86 + fVar99;
      fVar91 = local_11c0._0_4_;
      fVar93 = local_11c0._4_4_;
      auVar22._4_4_ = auVar128._4_4_ * fVar93;
      auVar22._0_4_ = auVar128._0_4_ * fVar91;
      fVar121 = local_11c0._8_4_;
      auVar22._8_4_ = auVar128._8_4_ * fVar121;
      fVar126 = local_11c0._12_4_;
      auVar22._12_4_ = auVar128._12_4_ * fVar126;
      fVar131 = local_11c0._16_4_;
      auVar22._16_4_ = auVar128._16_4_ * fVar131;
      fVar136 = local_11c0._20_4_;
      auVar22._20_4_ = auVar128._20_4_ * fVar136;
      fVar14 = local_11c0._24_4_;
      auVar22._24_4_ = auVar128._24_4_ * fVar14;
      auVar22._28_4_ = fVar86;
      auVar56 = vfmsub231ps_fma(auVar22,local_11a0,auVar83);
      auVar18 = vsubps_avx(auVar84,auVar58);
      fVar86 = auVar18._0_4_;
      fVar94 = auVar18._4_4_;
      auVar23._4_4_ = auVar83._4_4_ * fVar94;
      auVar23._0_4_ = auVar83._0_4_ * fVar86;
      fVar124 = auVar18._8_4_;
      auVar23._8_4_ = auVar83._8_4_ * fVar124;
      fVar129 = auVar18._12_4_;
      auVar23._12_4_ = auVar83._12_4_ * fVar129;
      fVar134 = auVar18._16_4_;
      auVar23._16_4_ = auVar83._16_4_ * fVar134;
      fVar12 = auVar18._20_4_;
      auVar23._20_4_ = auVar83._20_4_ * fVar12;
      fVar15 = auVar18._24_4_;
      auVar23._24_4_ = auVar83._24_4_ * fVar15;
      auVar23._28_4_ = auVar83._28_4_;
      auVar112._0_4_ = auVar84._0_4_ + auVar58._0_4_;
      auVar112._4_4_ = auVar84._4_4_ + auVar58._4_4_;
      auVar112._8_4_ = auVar84._8_4_ + auVar58._8_4_;
      auVar112._12_4_ = auVar84._12_4_ + auVar58._12_4_;
      auVar112._16_4_ = auVar84._16_4_ + auVar58._16_4_;
      auVar112._20_4_ = auVar84._20_4_ + auVar58._20_4_;
      auVar112._24_4_ = auVar84._24_4_ + auVar58._24_4_;
      auVar112._28_4_ = auVar84._28_4_ + auVar58._28_4_;
      auVar57 = vfmsub231ps_fma(auVar23,local_11c0,auVar112);
      fVar92 = local_11a0._0_4_;
      fVar95 = local_11a0._4_4_;
      auVar24._4_4_ = auVar112._4_4_ * fVar95;
      auVar24._0_4_ = auVar112._0_4_ * fVar92;
      fVar125 = local_11a0._8_4_;
      auVar24._8_4_ = auVar112._8_4_ * fVar125;
      fVar130 = local_11a0._12_4_;
      auVar24._12_4_ = auVar112._12_4_ * fVar130;
      fVar135 = local_11a0._16_4_;
      auVar24._16_4_ = auVar112._16_4_ * fVar135;
      fVar13 = local_11a0._20_4_;
      auVar24._20_4_ = auVar112._20_4_ * fVar13;
      fVar16 = local_11a0._24_4_;
      auVar24._24_4_ = auVar112._24_4_ * fVar16;
      auVar24._28_4_ = local_11c0._28_4_;
      auVar67 = vfmsub231ps_fma(auVar24,auVar18,auVar128);
      auVar25._4_4_ = auVar67._4_4_ * local_1180;
      auVar25._0_4_ = auVar67._0_4_ * local_1180;
      auVar25._8_4_ = auVar67._8_4_ * local_1180;
      auVar25._12_4_ = auVar67._12_4_ * local_1180;
      auVar25._16_4_ = local_1180 * 0.0;
      auVar25._20_4_ = local_1180 * 0.0;
      auVar25._24_4_ = local_1180 * 0.0;
      auVar25._28_4_ = auVar128._28_4_;
      auVar57 = vfmadd231ps_fma(auVar25,auVar117,ZEXT1632(auVar57));
      auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),local_1160,ZEXT1632(auVar56));
      auVar19 = vsubps_avx(auVar58,auVar60);
      auVar79._0_4_ = auVar58._0_4_ + auVar60._0_4_;
      auVar79._4_4_ = auVar58._4_4_ + auVar60._4_4_;
      auVar79._8_4_ = auVar58._8_4_ + auVar60._8_4_;
      auVar79._12_4_ = auVar58._12_4_ + auVar60._12_4_;
      auVar79._16_4_ = auVar58._16_4_ + auVar60._16_4_;
      auVar79._20_4_ = auVar58._20_4_ + auVar60._20_4_;
      auVar79._24_4_ = auVar58._24_4_ + auVar60._24_4_;
      auVar79._28_4_ = auVar58._28_4_ + auVar60._28_4_;
      auVar60 = vsubps_avx(auVar59,auVar77);
      auVar90._0_4_ = auVar59._0_4_ + auVar77._0_4_;
      auVar90._4_4_ = auVar59._4_4_ + auVar77._4_4_;
      auVar90._8_4_ = auVar59._8_4_ + auVar77._8_4_;
      auVar90._12_4_ = auVar59._12_4_ + auVar77._12_4_;
      auVar90._16_4_ = auVar59._16_4_ + auVar77._16_4_;
      auVar90._20_4_ = auVar59._20_4_ + auVar77._20_4_;
      auVar90._24_4_ = auVar59._24_4_ + auVar77._24_4_;
      auVar90._28_4_ = auVar59._28_4_ + auVar77._28_4_;
      auVar77 = vsubps_avx(auVar64,auVar17);
      auVar61._0_4_ = auVar64._0_4_ + auVar17._0_4_;
      auVar61._4_4_ = auVar64._4_4_ + auVar17._4_4_;
      auVar61._8_4_ = auVar64._8_4_ + auVar17._8_4_;
      auVar61._12_4_ = auVar64._12_4_ + auVar17._12_4_;
      auVar61._16_4_ = auVar64._16_4_ + auVar17._16_4_;
      auVar61._20_4_ = auVar64._20_4_ + auVar17._20_4_;
      auVar61._24_4_ = auVar64._24_4_ + auVar17._24_4_;
      auVar61._28_4_ = fVar99 + auVar17._28_4_;
      auVar17._4_4_ = auVar77._4_4_ * auVar90._4_4_;
      auVar17._0_4_ = auVar77._0_4_ * auVar90._0_4_;
      auVar17._8_4_ = auVar77._8_4_ * auVar90._8_4_;
      auVar17._12_4_ = auVar77._12_4_ * auVar90._12_4_;
      auVar17._16_4_ = auVar77._16_4_ * auVar90._16_4_;
      auVar17._20_4_ = auVar77._20_4_ * auVar90._20_4_;
      auVar17._24_4_ = auVar77._24_4_ * auVar90._24_4_;
      auVar17._28_4_ = fVar99;
      auVar67 = vfmsub231ps_fma(auVar17,auVar60,auVar61);
      auVar26._4_4_ = auVar61._4_4_ * auVar19._4_4_;
      auVar26._0_4_ = auVar61._0_4_ * auVar19._0_4_;
      auVar26._8_4_ = auVar61._8_4_ * auVar19._8_4_;
      auVar26._12_4_ = auVar61._12_4_ * auVar19._12_4_;
      auVar26._16_4_ = auVar61._16_4_ * auVar19._16_4_;
      auVar26._20_4_ = auVar61._20_4_ * auVar19._20_4_;
      auVar26._24_4_ = auVar61._24_4_ * auVar19._24_4_;
      auVar26._28_4_ = auVar61._28_4_;
      auVar56 = vfmsub231ps_fma(auVar26,auVar77,auVar79);
      auVar27._4_4_ = auVar60._4_4_ * auVar79._4_4_;
      auVar27._0_4_ = auVar60._0_4_ * auVar79._0_4_;
      auVar27._8_4_ = auVar60._8_4_ * auVar79._8_4_;
      auVar27._12_4_ = auVar60._12_4_ * auVar79._12_4_;
      auVar27._16_4_ = auVar60._16_4_ * auVar79._16_4_;
      auVar27._20_4_ = auVar60._20_4_ * auVar79._20_4_;
      auVar27._24_4_ = auVar60._24_4_ * auVar79._24_4_;
      auVar27._28_4_ = auVar79._28_4_;
      auVar68 = vfmsub231ps_fma(auVar27,auVar19,auVar90);
      fStack_117c = local_1180;
      fStack_1178 = local_1180;
      fStack_1174 = local_1180;
      fStack_1170 = local_1180;
      fStack_116c = local_1180;
      fStack_1168 = local_1180;
      fStack_1164 = local_1180;
      auVar80._0_4_ = local_1180 * auVar68._0_4_;
      auVar80._4_4_ = local_1180 * auVar68._4_4_;
      auVar80._8_4_ = local_1180 * auVar68._8_4_;
      auVar80._12_4_ = local_1180 * auVar68._12_4_;
      auVar80._16_4_ = local_1180 * 0.0;
      auVar80._20_4_ = local_1180 * 0.0;
      auVar80._24_4_ = local_1180 * 0.0;
      auVar80._28_4_ = 0;
      auVar56 = vfmadd231ps_fma(auVar80,auVar117,ZEXT1632(auVar56));
      auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),local_1160,ZEXT1632(auVar67));
      local_13e0 = ZEXT1632(CONCAT412(auVar56._12_4_ + auVar57._12_4_ + local_1420._12_4_,
                                      CONCAT48(auVar56._8_4_ + auVar57._8_4_ + local_1420._8_4_,
                                               CONCAT44(auVar56._4_4_ +
                                                        auVar57._4_4_ + local_1420._4_4_,
                                                        auVar56._0_4_ +
                                                        auVar57._0_4_ + local_1420._0_4_))));
      auVar62._8_4_ = 0x7fffffff;
      auVar62._0_8_ = 0x7fffffff7fffffff;
      auVar62._12_4_ = 0x7fffffff;
      auVar62._16_4_ = 0x7fffffff;
      auVar62._20_4_ = 0x7fffffff;
      auVar62._24_4_ = 0x7fffffff;
      auVar62._28_4_ = 0x7fffffff;
      local_1400 = ZEXT1632(auVar57);
      auVar58 = vminps_avx(ZEXT1632(local_1420),local_1400);
      auVar58 = vminps_avx(auVar58,ZEXT1632(auVar56));
      local_1200 = vandps_avx(local_13e0,auVar62);
      fVar99 = local_1200._0_4_ * 1.1920929e-07;
      fVar102 = local_1200._4_4_ * 1.1920929e-07;
      auVar28._4_4_ = fVar102;
      auVar28._0_4_ = fVar99;
      fVar103 = local_1200._8_4_ * 1.1920929e-07;
      auVar28._8_4_ = fVar103;
      fVar104 = local_1200._12_4_ * 1.1920929e-07;
      auVar28._12_4_ = fVar104;
      fVar105 = local_1200._16_4_ * 1.1920929e-07;
      auVar28._16_4_ = fVar105;
      fVar106 = local_1200._20_4_ * 1.1920929e-07;
      auVar28._20_4_ = fVar106;
      fVar107 = local_1200._24_4_ * 1.1920929e-07;
      auVar28._24_4_ = fVar107;
      auVar28._28_4_ = 0x34000000;
      auVar96._0_8_ = CONCAT44(fVar102,fVar99) ^ 0x8000000080000000;
      auVar96._8_4_ = -fVar103;
      auVar96._12_4_ = -fVar104;
      auVar96._16_4_ = -fVar105;
      auVar96._20_4_ = -fVar106;
      auVar96._24_4_ = -fVar107;
      auVar96._28_4_ = 0xb4000000;
      auVar58 = vcmpps_avx(auVar58,auVar96,5);
      local_11e0 = ZEXT1632(local_1420);
      auVar64 = vmaxps_avx(ZEXT1632(local_1420),local_1400);
      auVar59 = vmaxps_avx(auVar64,ZEXT1632(auVar56));
      auVar59 = vcmpps_avx(auVar59,auVar28,2);
      auVar59 = vorps_avx(auVar58,auVar59);
      if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar59 >> 0x7f,0) != '\0') ||
            (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar59 >> 0xbf,0) != '\0') ||
          (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar59[0x1f] < '\0') {
        auVar29._4_4_ = fVar95 * local_1120._4_4_;
        auVar29._0_4_ = fVar92 * local_1120._0_4_;
        auVar29._8_4_ = fVar125 * local_1120._8_4_;
        auVar29._12_4_ = fVar130 * local_1120._12_4_;
        auVar29._16_4_ = fVar135 * local_1120._16_4_;
        auVar29._20_4_ = fVar13 * local_1120._20_4_;
        auVar29._24_4_ = fVar16 * local_1120._24_4_;
        auVar29._28_4_ = auVar58._28_4_;
        auVar30._4_4_ = local_1140._4_4_ * fVar94;
        auVar30._0_4_ = local_1140._0_4_ * fVar86;
        auVar30._8_4_ = local_1140._8_4_ * fVar124;
        auVar30._12_4_ = local_1140._12_4_ * fVar129;
        auVar30._16_4_ = local_1140._16_4_ * fVar134;
        auVar30._20_4_ = local_1140._20_4_ * fVar12;
        auVar30._24_4_ = local_1140._24_4_ * fVar15;
        auVar30._28_4_ = 0x34000000;
        auVar56 = vfmsub213ps_fma(local_1140,local_11c0,auVar29);
        auVar31._4_4_ = auVar60._4_4_ * fVar93;
        auVar31._0_4_ = auVar60._0_4_ * fVar91;
        auVar31._8_4_ = auVar60._8_4_ * fVar121;
        auVar31._12_4_ = auVar60._12_4_ * fVar126;
        auVar31._16_4_ = auVar60._16_4_ * fVar131;
        auVar31._20_4_ = auVar60._20_4_ * fVar136;
        auVar31._24_4_ = auVar60._24_4_ * fVar14;
        auVar31._28_4_ = auVar64._28_4_;
        auVar32._4_4_ = auVar77._4_4_ * fVar94;
        auVar32._0_4_ = auVar77._0_4_ * fVar86;
        auVar32._8_4_ = auVar77._8_4_ * fVar124;
        auVar32._12_4_ = auVar77._12_4_ * fVar129;
        auVar32._16_4_ = auVar77._16_4_ * fVar134;
        auVar32._20_4_ = auVar77._20_4_ * fVar12;
        auVar32._24_4_ = auVar77._24_4_ * fVar15;
        auVar32._28_4_ = local_1200._28_4_;
        auVar67 = vfmsub213ps_fma(auVar77,local_11a0,auVar31);
        auVar58 = vandps_avx(auVar29,auVar62);
        auVar64 = vandps_avx(auVar31,auVar62);
        auVar58 = vcmpps_avx(auVar58,auVar64,1);
        local_13c0 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar56),auVar58);
        auVar33._4_4_ = fVar95 * auVar19._4_4_;
        auVar33._0_4_ = fVar92 * auVar19._0_4_;
        auVar33._8_4_ = fVar125 * auVar19._8_4_;
        auVar33._12_4_ = fVar130 * auVar19._12_4_;
        auVar33._16_4_ = fVar135 * auVar19._16_4_;
        auVar33._20_4_ = fVar13 * auVar19._20_4_;
        auVar33._24_4_ = fVar16 * auVar19._24_4_;
        auVar33._28_4_ = auVar58._28_4_;
        auVar56 = vfmsub213ps_fma(auVar19,local_11c0,auVar32);
        auVar34._4_4_ = local_1100._4_4_ * fVar93;
        auVar34._0_4_ = local_1100._0_4_ * fVar91;
        auVar34._8_4_ = local_1100._8_4_ * fVar121;
        auVar34._12_4_ = local_1100._12_4_ * fVar126;
        auVar34._16_4_ = local_1100._16_4_ * fVar131;
        auVar34._20_4_ = local_1100._20_4_ * fVar136;
        auVar34._24_4_ = local_1100._24_4_ * fVar14;
        auVar34._28_4_ = auVar64._28_4_;
        auVar67 = vfmsub213ps_fma(local_1120,auVar18,auVar34);
        auVar58 = vandps_avx(auVar34,auVar62);
        auVar64 = vandps_avx(auVar32,auVar62);
        auVar58 = vcmpps_avx(auVar58,auVar64,1);
        local_13a0 = vblendvps_avx(ZEXT1632(auVar56),ZEXT1632(auVar67),auVar58);
        auVar56 = vfmsub213ps_fma(local_1100,local_11a0,auVar30);
        auVar67 = vfmsub213ps_fma(auVar60,auVar18,auVar33);
        auVar58 = vandps_avx(auVar30,auVar62);
        auVar64 = vandps_avx(auVar33,auVar62);
        auVar64 = vcmpps_avx(auVar58,auVar64,1);
        local_1380 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar56),auVar64);
        auVar56 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
        fVar86 = local_1380._0_4_;
        auVar63._0_4_ = fVar86 * local_1180;
        fVar99 = local_1380._4_4_;
        auVar63._4_4_ = fVar99 * local_1180;
        fVar91 = local_1380._8_4_;
        auVar63._8_4_ = fVar91 * local_1180;
        fVar92 = local_1380._12_4_;
        auVar63._12_4_ = fVar92 * local_1180;
        fVar93 = local_1380._16_4_;
        auVar63._16_4_ = fVar93 * local_1180;
        fVar94 = local_1380._20_4_;
        auVar63._20_4_ = fVar94 * local_1180;
        fVar95 = local_1380._24_4_;
        auVar63._24_4_ = fVar95 * local_1180;
        auVar63._28_4_ = 0;
        auVar67 = vfmadd213ps_fma(auVar117,local_13a0,auVar63);
        auVar67 = vfmadd213ps_fma(local_1160,local_13c0,ZEXT1632(auVar67));
        auVar64 = ZEXT1632(CONCAT412(auVar67._12_4_ + auVar67._12_4_,
                                     CONCAT48(auVar67._8_4_ + auVar67._8_4_,
                                              CONCAT44(auVar67._4_4_ + auVar67._4_4_,
                                                       auVar67._0_4_ + auVar67._0_4_))));
        auVar35._4_4_ = fVar99 * fVar127;
        auVar35._0_4_ = fVar86 * fVar122;
        auVar35._8_4_ = fVar91 * fVar132;
        auVar35._12_4_ = fVar92 * fVar111;
        auVar35._16_4_ = fVar93 * fVar115;
        auVar35._20_4_ = fVar94 * fVar118;
        auVar35._24_4_ = fVar95 * fVar114;
        auVar35._28_4_ = auVar58._28_4_;
        auVar67 = vfmadd213ps_fma(auVar71,local_13a0,auVar35);
        auVar68 = vfmadd213ps_fma(auVar84,local_13c0,ZEXT1632(auVar67));
        auVar58 = vrcpps_avx(auVar64);
        auVar113._8_4_ = 0x3f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._12_4_ = 0x3f800000;
        auVar113._16_4_ = 0x3f800000;
        auVar113._20_4_ = 0x3f800000;
        auVar113._24_4_ = 0x3f800000;
        auVar113._28_4_ = 0x3f800000;
        auVar67 = vfnmadd213ps_fma(auVar58,auVar64,auVar113);
        auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar58,auVar58);
        local_1300._28_4_ = 0x3f800000;
        local_1300._0_28_ =
             ZEXT1628(CONCAT412(auVar67._12_4_ * (auVar68._12_4_ + auVar68._12_4_),
                                CONCAT48(auVar67._8_4_ * (auVar68._8_4_ + auVar68._8_4_),
                                         CONCAT44(auVar67._4_4_ * (auVar68._4_4_ + auVar68._4_4_),
                                                  auVar67._0_4_ * (auVar68._0_4_ + auVar68._0_4_))))
                     );
        auVar55 = ZEXT3264(local_1300);
        uVar119 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar84._4_4_ = uVar119;
        auVar84._0_4_ = uVar119;
        auVar84._8_4_ = uVar119;
        auVar84._12_4_ = uVar119;
        auVar84._16_4_ = uVar119;
        auVar84._20_4_ = uVar119;
        auVar84._24_4_ = uVar119;
        auVar84._28_4_ = uVar119;
        uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar120._4_4_ = uVar119;
        auVar120._0_4_ = uVar119;
        auVar120._8_4_ = uVar119;
        auVar120._12_4_ = uVar119;
        auVar120._16_4_ = uVar119;
        auVar120._20_4_ = uVar119;
        auVar120._24_4_ = uVar119;
        auVar120._28_4_ = uVar119;
        auVar97 = ZEXT3264(auVar120);
        auVar58 = vcmpps_avx(auVar84,local_1300,2);
        auVar59 = vcmpps_avx(local_1300,auVar120,2);
        auVar58 = vandps_avx(auVar59,auVar58);
        auVar67 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
        auVar56 = vpand_avx(auVar67,auVar56);
        auVar58 = vpmovsxwd_avx2(auVar56);
        if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar58 >> 0x7f,0) != '\0') ||
              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar58 >> 0xbf,0) != '\0') ||
            (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar58[0x1f] < '\0') {
          auVar58 = vcmpps_avx(auVar64,_DAT_01f7b000,4);
          auVar67 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
          auVar56 = vpand_avx(auVar56,auVar67);
          local_1540 = vpmovsxwd_avx2(auVar56);
          if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_1540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_1540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_1540 >> 0x7f,0) != '\0') ||
                (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_1540 >> 0xbf,0) != '\0') ||
              (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_1540[0x1f] < '\0') {
            uStack_1410 = 0;
            uStack_140c = 0;
            uStack_1408 = 0;
            uStack_1404 = 0;
            local_1360 = local_1540;
            local_1280 = local_1220;
            auVar58 = vrcpps_avx(local_13e0);
            auVar109._8_4_ = 0x3f800000;
            auVar109._0_8_ = 0x3f8000003f800000;
            auVar109._12_4_ = 0x3f800000;
            auVar109._16_4_ = 0x3f800000;
            auVar109._20_4_ = 0x3f800000;
            auVar109._24_4_ = 0x3f800000;
            auVar109._28_4_ = 0x3f800000;
            auVar67 = vfnmadd213ps_fma(local_13e0,auVar58,auVar109);
            auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar58,auVar58);
            auVar85._8_4_ = 0x219392ef;
            auVar85._0_8_ = 0x219392ef219392ef;
            auVar85._12_4_ = 0x219392ef;
            auVar85._16_4_ = 0x219392ef;
            auVar85._20_4_ = 0x219392ef;
            auVar85._24_4_ = 0x219392ef;
            auVar85._28_4_ = 0x219392ef;
            auVar58 = vcmpps_avx(local_1200,auVar85,5);
            auVar58 = vandps_avx(auVar58,ZEXT1632(auVar67));
            auVar36._4_4_ = local_1420._4_4_ * auVar58._4_4_;
            auVar36._0_4_ = local_1420._0_4_ * auVar58._0_4_;
            auVar36._8_4_ = local_1420._8_4_ * auVar58._8_4_;
            auVar36._12_4_ = local_1420._12_4_ * auVar58._12_4_;
            auVar36._16_4_ = auVar58._16_4_ * 0.0;
            auVar36._20_4_ = auVar58._20_4_ * 0.0;
            auVar36._24_4_ = auVar58._24_4_ * 0.0;
            auVar36._28_4_ = 0;
            auVar59 = vminps_avx(auVar36,auVar109);
            auVar37._4_4_ = auVar57._4_4_ * auVar58._4_4_;
            auVar37._0_4_ = auVar57._0_4_ * auVar58._0_4_;
            auVar37._8_4_ = auVar57._8_4_ * auVar58._8_4_;
            auVar37._12_4_ = auVar57._12_4_ * auVar58._12_4_;
            auVar37._16_4_ = auVar58._16_4_ * 0.0;
            auVar37._20_4_ = auVar58._20_4_ * 0.0;
            auVar37._24_4_ = auVar58._24_4_ * 0.0;
            auVar37._28_4_ = auVar18._28_4_;
            auVar58 = vminps_avx(auVar37,auVar109);
            auVar64 = vsubps_avx(auVar109,auVar59);
            auVar84 = vsubps_avx(auVar109,auVar58);
            local_1320 = vblendvps_avx(auVar58,auVar64,local_1220);
            local_1340 = vblendvps_avx(auVar59,auVar84,local_1220);
            local_12e0[0] = local_13c0._0_4_ * (float)local_1240._0_4_;
            local_12e0[1] = local_13c0._4_4_ * (float)local_1240._4_4_;
            local_12e0[2] = local_13c0._8_4_ * fStack_1238;
            local_12e0[3] = local_13c0._12_4_ * fStack_1234;
            fStack_12d0 = local_13c0._16_4_ * fStack_1230;
            fStack_12cc = local_13c0._20_4_ * fStack_122c;
            fStack_12c8 = local_13c0._24_4_ * fStack_1228;
            uStack_12c4 = local_1340._28_4_;
            local_12c0[0] = (float)local_1240._0_4_ * local_13a0._0_4_;
            local_12c0[1] = (float)local_1240._4_4_ * local_13a0._4_4_;
            local_12c0[2] = fStack_1238 * local_13a0._8_4_;
            local_12c0[3] = fStack_1234 * local_13a0._12_4_;
            fStack_12b0 = fStack_1230 * local_13a0._16_4_;
            fStack_12ac = fStack_122c * local_13a0._20_4_;
            fStack_12a8 = fStack_1228 * local_13a0._24_4_;
            uStack_12a4 = local_1320._28_4_;
            local_12a0[0] = (float)local_1240._0_4_ * fVar86;
            local_12a0[1] = (float)local_1240._4_4_ * fVar99;
            local_12a0[2] = fStack_1238 * fVar91;
            local_12a0[3] = fStack_1234 * fVar92;
            fStack_1290 = fStack_1230 * fVar93;
            fStack_128c = fStack_122c * fVar94;
            fStack_1288 = fStack_1228 * fVar95;
            uStack_1284 = uStack_1224;
            auVar58 = vpmovsxwd_avx2(auVar56);
            auVar73._8_4_ = 0x7f800000;
            auVar73._0_8_ = 0x7f8000007f800000;
            auVar73._12_4_ = 0x7f800000;
            auVar73._16_4_ = 0x7f800000;
            auVar73._20_4_ = 0x7f800000;
            auVar73._24_4_ = 0x7f800000;
            auVar73._28_4_ = 0x7f800000;
            auVar58 = vblendvps_avx(auVar73,local_1300,auVar58);
            auVar59 = vshufps_avx(auVar58,auVar58,0xb1);
            auVar59 = vminps_avx(auVar58,auVar59);
            auVar64 = vshufpd_avx(auVar59,auVar59,5);
            auVar59 = vminps_avx(auVar59,auVar64);
            auVar64 = vpermpd_avx2(auVar59,0x4e);
            auVar59 = vminps_avx(auVar59,auVar64);
            auVar58 = vcmpps_avx(auVar58,auVar59,0);
            auVar57 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar57 = vpand_avx(auVar57,auVar56);
            auVar58 = vpmovsxwd_avx2(auVar57);
            if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar58 >> 0x7f,0) == '\0') &&
                  (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar58 >> 0xbf,0) == '\0') &&
                (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar58[0x1f]) {
              auVar58 = local_1540;
            }
            uVar41 = vmovmskps_avx(auVar58);
            uVar40 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
              uVar40 = uVar40 + 1;
            }
            auVar58 = vpcmpeqd_avx2(auVar84,auVar84);
            auVar98 = ZEXT3264(auVar58);
            do {
              uVar45 = CONCAT44(0,uVar40);
              uVar40 = *(uint *)((long)&local_10e0 + uVar45 * 4);
              pGVar10 = (pSVar4->geometries).items[uVar40].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1540 + uVar45 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar119 = *(undefined4 *)(local_1340 + uVar45 * 4);
                  uVar2 = *(undefined4 *)(local_1320 + uVar45 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar45 - 8];
                  *(float *)(ray + k * 4 + 0x180) = local_12e0[uVar45];
                  *(float *)(ray + k * 4 + 0x1a0) = local_12c0[uVar45];
                  *(float *)(ray + k * 4 + 0x1c0) = local_12a0[uVar45];
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar119;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1440 + uVar45 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar40;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1060 = *(undefined4 *)(local_1340 + uVar45 * 4);
                local_1040 = *(undefined4 *)(local_1320 + uVar45 * 4);
                uVar119 = *(undefined4 *)((long)&local_1440 + uVar45 * 4);
                local_1020._4_4_ = uVar119;
                local_1020._0_4_ = uVar119;
                local_1020._8_4_ = uVar119;
                local_1020._12_4_ = uVar119;
                local_1020._16_4_ = uVar119;
                local_1020._20_4_ = uVar119;
                local_1020._24_4_ = uVar119;
                local_1020._28_4_ = uVar119;
                fVar122 = local_12e0[uVar45];
                fVar127 = local_12c0[uVar45];
                local_10a0._4_4_ = fVar127;
                local_10a0._0_4_ = fVar127;
                local_10a0._8_4_ = fVar127;
                local_10a0._12_4_ = fVar127;
                local_10a0._16_4_ = fVar127;
                local_10a0._20_4_ = fVar127;
                local_10a0._24_4_ = fVar127;
                local_10a0._28_4_ = fVar127;
                fVar127 = local_12a0[uVar45];
                local_1080._4_4_ = fVar127;
                local_1080._0_4_ = fVar127;
                local_1080._8_4_ = fVar127;
                local_1080._12_4_ = fVar127;
                local_1080._16_4_ = fVar127;
                local_1080._20_4_ = fVar127;
                local_1080._24_4_ = fVar127;
                local_1080._28_4_ = fVar127;
                local_1000._4_4_ = uVar40;
                local_1000._0_4_ = uVar40;
                local_1000._8_4_ = uVar40;
                local_1000._12_4_ = uVar40;
                local_1000._16_4_ = uVar40;
                local_1000._20_4_ = uVar40;
                local_1000._24_4_ = uVar40;
                local_1000._28_4_ = uVar40;
                local_10c0[0] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[1] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[2] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[3] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[4] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[5] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[6] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[7] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[8] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[9] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[10] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0xb] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[0xc] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[0xd] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[0xe] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0xf] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[0x10] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[0x11] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[0x14] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[0x15] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[0x18] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[0x19] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                local_10c0[0x1c] = (RTCHitN)SUB41(fVar122,0);
                local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar122 >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar122 >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar122 >> 0x18);
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar45 - 8];
                local_1500 = local_1260;
                local_15d0.valid = (int *)local_1500;
                local_15d0.geometryUserPtr = pGVar10->userPtr;
                local_15d0.context = context->user;
                local_15d0.hit = local_10c0;
                local_15d0.N = 8;
                local_15d0.ray = (RTCRayN *)ray;
                if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_1560 = auVar55._0_32_;
                  local_1580 = auVar97._0_32_;
                  local_15a0._0_8_ = uVar45;
                  auVar58 = ZEXT1632(auVar98._0_16_);
                  (*pGVar10->intersectionFilterN)(&local_15d0);
                  auVar97 = ZEXT3264(local_1580);
                  auVar55 = ZEXT3264(local_1560);
                  auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                  auVar98 = ZEXT3264(auVar58);
                  uVar45 = local_15a0._0_8_;
                }
                auVar59 = vpcmpeqd_avx2(local_1500,_DAT_01f7b000);
                auVar58 = auVar98._0_32_ & ~auVar59;
                if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar58 >> 0x7f,0) == '\0') &&
                      (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar58 >> 0xbf,0) == '\0') &&
                    (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar58[0x1f]) {
                  auVar59 = auVar59 ^ auVar98._0_32_;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_1560 = auVar55._0_32_;
                    local_1580 = auVar97._0_32_;
                    local_15a0._0_8_ = uVar45;
                    auVar58 = ZEXT1632(auVar98._0_16_);
                    (*p_Var11)(&local_15d0);
                    auVar97 = ZEXT3264(local_1580);
                    auVar55 = ZEXT3264(local_1560);
                    auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                    auVar98 = ZEXT3264(auVar58);
                    uVar45 = local_15a0._0_8_;
                  }
                  auVar64 = vpcmpeqd_avx2(local_1500,_DAT_01f7b000);
                  auVar59 = auVar64 ^ auVar98._0_32_;
                  auVar58 = auVar98._0_32_ & ~auVar64;
                  if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar58 >> 0x7f,0) != '\0') ||
                        (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar58 >> 0xbf,0) != '\0') ||
                      (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar58[0x1f] < '\0') {
                    auVar66._0_4_ = auVar64._0_4_ ^ auVar98._0_4_;
                    auVar66._4_4_ = auVar64._4_4_ ^ auVar98._4_4_;
                    auVar66._8_4_ = auVar64._8_4_ ^ auVar98._8_4_;
                    auVar66._12_4_ = auVar64._12_4_ ^ auVar98._12_4_;
                    auVar66._16_4_ = auVar64._16_4_ ^ auVar98._16_4_;
                    auVar66._20_4_ = auVar64._20_4_ ^ auVar98._20_4_;
                    auVar66._24_4_ = auVar64._24_4_ ^ auVar98._24_4_;
                    auVar66._28_4_ = auVar64._28_4_ ^ auVar98._28_4_;
                    auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])local_15d0.hit);
                    *(undefined1 (*) [32])(local_15d0.ray + 0x180) = auVar58;
                    auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0x20));
                    *(undefined1 (*) [32])(local_15d0.ray + 0x1a0) = auVar58;
                    auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0x40));
                    *(undefined1 (*) [32])(local_15d0.ray + 0x1c0) = auVar58;
                    auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0x60));
                    *(undefined1 (*) [32])(local_15d0.ray + 0x1e0) = auVar58;
                    auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0x80));
                    *(undefined1 (*) [32])(local_15d0.ray + 0x200) = auVar58;
                    auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_15d0.ray + 0x220) = auVar58;
                    auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_15d0.ray + 0x240) = auVar58;
                    auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_15d0.ray + 0x260) = auVar58;
                    auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])(local_15d0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_15d0.ray + 0x280) = auVar58;
                  }
                }
                if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar59 >> 0x7f,0) == '\0') &&
                      (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar59 >> 0xbf,0) == '\0') &&
                    (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar59[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar97._0_4_;
                }
                else {
                  auVar97 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1540 + uVar45 * 4) = 0;
                uVar119 = auVar97._0_4_;
                auVar54._4_4_ = uVar119;
                auVar54._0_4_ = uVar119;
                auVar54._8_4_ = uVar119;
                auVar54._12_4_ = uVar119;
                auVar54._16_4_ = uVar119;
                auVar54._20_4_ = uVar119;
                auVar54._24_4_ = uVar119;
                auVar54._28_4_ = uVar119;
                auVar58 = vcmpps_avx(auVar55._0_32_,auVar54,2);
                local_1540 = vandps_avx(auVar58,local_1540);
              }
              if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1540 >> 0x7f,0) == '\0') &&
                    (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1540 >> 0xbf,0) == '\0') &&
                  (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1540[0x1f]) break;
              auVar65._8_4_ = 0x7f800000;
              auVar65._0_8_ = 0x7f8000007f800000;
              auVar65._12_4_ = 0x7f800000;
              auVar65._16_4_ = 0x7f800000;
              auVar65._20_4_ = 0x7f800000;
              auVar65._24_4_ = 0x7f800000;
              auVar65._28_4_ = 0x7f800000;
              auVar58 = vblendvps_avx(auVar65,auVar55._0_32_,local_1540);
              auVar59 = vshufps_avx(auVar58,auVar58,0xb1);
              auVar59 = vminps_avx(auVar58,auVar59);
              auVar64 = vshufpd_avx(auVar59,auVar59,5);
              auVar59 = vminps_avx(auVar59,auVar64);
              auVar64 = vpermpd_avx2(auVar59,0x4e);
              auVar59 = vminps_avx(auVar59,auVar64);
              auVar59 = vcmpps_avx(auVar58,auVar59,0);
              auVar64 = local_1540 & auVar59;
              auVar58 = local_1540;
              if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar64 >> 0x7f,0) != '\0') ||
                    (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar64 >> 0xbf,0) != '\0') ||
                  (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar64[0x1f] < '\0') {
                auVar58 = vandps_avx(auVar59,local_1540);
              }
              uVar41 = vmovmskps_avx(auVar58);
              uVar40 = 0;
              for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x80000000) {
                uVar40 = uVar40 + 1;
              }
            } while( true );
          }
        }
      }
      auVar98 = ZEXT1664(local_1450);
      auVar101 = ZEXT1664(local_1460);
      auVar110 = ZEXT1664(local_1470);
      auVar97 = ZEXT1664(local_1510);
      fVar111 = local_1480;
      fVar114 = fStack_147c;
      fVar86 = fStack_1478;
      fVar99 = fStack_1474;
      fVar115 = local_1490;
      fVar91 = fStack_148c;
      fVar92 = fStack_1488;
      fVar93 = fStack_1484;
      fVar118 = local_14a0;
      fVar94 = fStack_149c;
      fVar95 = fStack_1498;
      fVar121 = fStack_1494;
      fVar122 = local_14b0;
      fVar124 = fStack_14ac;
      fVar125 = fStack_14a8;
      fVar126 = fStack_14a4;
      fVar127 = local_14c0;
      fVar129 = fStack_14bc;
      fVar130 = fStack_14b8;
      fVar131 = fStack_14b4;
      fVar132 = local_14d0;
      fVar134 = fStack_14cc;
      fVar135 = fStack_14c8;
      fVar136 = fStack_14c4;
    }
    uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar55 = ZEXT1664(CONCAT412(uVar119,CONCAT48(uVar119,CONCAT44(uVar119,uVar119))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }